

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode Subscription_unregisterPublishJob(UA_Server *server,UA_Subscription *sub)

{
  uint local_60;
  uint local_58;
  uint local_54;
  UA_Subscription *sub_local;
  UA_Server *server_local;
  
  if ((sub->publishJobIsRegistered & 1U) == 0) {
    server_local._4_4_ = 0;
  }
  else {
    if (sub->session->channel == (UA_SecureChannel *)0x0) {
      local_58 = 0;
    }
    else {
      if (sub->session->channel->connection == (UA_Connection *)0x0) {
        local_54 = 0;
      }
      else {
        local_54 = sub->session->channel->connection->sockfd;
      }
      local_58 = local_54;
    }
    if (sub->session->channel == (UA_SecureChannel *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = (sub->session->channel->securityToken).channelId;
    }
    UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Unregister subscription publishing callback"
                 ,(ulong)local_58,(ulong)local_60,
                 (ulong)(sub->session->sessionId).identifier.numeric,
                 (uint)(sub->session->sessionId).identifier.guid.data2,
                 (uint)(sub->session->sessionId).identifier.guid.data3,
                 (uint)(sub->session->sessionId).identifier.guid.data4[0],
                 (uint)(sub->session->sessionId).identifier.guid.data4[1],
                 (uint)(sub->session->sessionId).identifier.guid.data4[2],
                 (uint)(sub->session->sessionId).identifier.guid.data4[3],
                 (uint)(sub->session->sessionId).identifier.guid.data4[4],
                 (uint)(sub->session->sessionId).identifier.guid.data4[5],
                 (uint)(sub->session->sessionId).identifier.guid.data4[6],
                 (uint)(sub->session->sessionId).identifier.guid.data4[7],sub->subscriptionID);
    sub->publishJobIsRegistered = false;
    server_local._4_4_ = UA_Server_removeRepeatedJob(server,sub->publishJobGuid);
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
Subscription_unregisterPublishJob(UA_Server *server, UA_Subscription *sub) {
    if(!sub->publishJobIsRegistered)
        return UA_STATUSCODE_GOOD;
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Unregister subscription publishing callback",
                         sub->subscriptionID);
    sub->publishJobIsRegistered = false;
    return UA_Server_removeRepeatedJob(server, sub->publishJobGuid);
}